

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometricsizeclass.h
# Opt level: O2

int Hoard::GeometricSizeClass<20UL,_16UL>::size2class(size_t sz)

{
  ulong uVar1;
  int iVar2;
  unsigned_long uVar3;
  ulong uVar4;
  int iVar5;
  
  uVar4 = 0x6e;
  iVar2 = 0;
  while (iVar5 = iVar2, iVar5 < (int)uVar4) {
    uVar1 = (long)(iVar5 + (int)uVar4) / 2;
    iVar2 = (int)uVar1;
    uVar3 = c2s(iVar2);
    if (uVar3 < sz) {
      uVar1 = uVar4;
    }
    uVar4 = uVar1 & 0xffffffff;
    iVar2 = iVar2 + 1;
    if (uVar3 >= sz) {
      iVar2 = iVar5;
    }
  }
  return iVar5;
}

Assistant:

static int constexpr size2class (const size_t sz) {
      // Do a binary search to find the right size class.
      int left  = 0;
      int right = NUM_SIZECLASSES - 1;
      while (left < right) {
	int mid = (left + right)/2;
	if (c2s(mid) < sz) {
	  left = mid + 1;
	} else {
	  right = mid;
	}
      }
      assert (c2s(left) >= sz);
      assert ((left == 0) || (c2s(left-1) < sz));
      return left;
    }